

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

_Bool cmdq_pop(cmd_context c)

{
  byte *pbVar1;
  uint32_t *puVar2;
  int iVar3;
  player_upkeep *ppVar4;
  cmd_handler_fn p_Var5;
  player *ppVar6;
  _Bool _Var7;
  wchar_t wVar8;
  int iVar9;
  uint32_t uVar10;
  size_t i;
  long lVar11;
  cmd_code cVar12;
  wchar_t wVar13;
  command_info *pcVar14;
  
  ppVar6 = player;
  if (repeating == '\x01') {
    wVar8 = (cmd_tail + L'\x13') % 0x14;
    wVar13 = cmd_tail;
  }
  else {
    wVar13 = L'\0';
    if (cmd_head == cmd_tail) goto LAB_0012fda7;
    wVar8 = cmd_tail;
    if (cmd_tail + L'\x01' != L'\x14') {
      wVar13 = cmd_tail + L'\x01';
    }
  }
  cmd_tail = wVar13;
  if (cmd_queue[wVar8].background_command == 0) {
    last_command_idx = cmd_tail + ((cmd_tail + L'\x13') / 0x14) * -0x14 + L'\x13';
  }
  cVar12 = CMD_COMMAND_MONSTER;
  if (player->timed[0x2c] == 0) {
    cVar12 = cmd_queue[wVar8].code;
  }
  iVar3 = cmd_queue[wVar8].nrepeats;
  pcVar14 = game_cmds;
  lVar11 = 0;
  do {
    if (pcVar14->cmd == cVar12) goto LAB_0012fc5e;
    lVar11 = lVar11 + 1;
    pcVar14 = pcVar14 + 1;
  } while (lVar11 != 0x74);
  lVar11 = 0xffffffff;
LAB_0012fc5e:
  ppVar4 = player->upkeep;
  ppVar4->command_wrk = L'\0';
  wVar13 = L'\x01';
  iVar9 = (int)lVar11;
  if (iVar9 != -1) {
    if (game_cmds[iVar9].repeat_allowed == true) {
      if ((L'\0' < game_cmds[iVar9].auto_repeat_n) && (iVar3 == 0)) {
        cmd_queue[cmd_tail + ((cmd_tail + L'\x13') / 0x14) * -0x14 + 0x13].nrepeats =
             game_cmds[iVar9].auto_repeat_n;
        repeating = '\x01';
        pbVar1 = (byte *)((long)&ppVar4->redraw + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
    }
    else {
      cmd_queue[wVar8].nrepeats = 0;
      repeating = '\0';
    }
    repeat_prev_allowed = 1;
    cmd_queue[wVar8].context = c;
    p_Var5 = game_cmds[iVar9].fn;
    if (p_Var5 != (cmd_handler_fn)0x0) {
      if (cmd_queue[wVar8].background_command < 2) {
        if ((game_cmds[iVar9].can_use_energy == true) && (ppVar6->skip_cmd_coercion == '\0')) {
          uVar10 = Rand_div(200);
          if ((int)uVar10 < (int)player->timed[0x31]) {
            _Var7 = player_attack_random_monster(player);
            if (_Var7) goto LAB_0012fda7;
          }
          else if (player->timed[0x31] != 0) {
            player->skip_cmd_coercion = '\x01';
          }
        }
      }
      else if ((ppVar6->skip_cmd_coercion != '\0') && (game_cmds[iVar9].can_use_energy == true)) {
        ppVar6->skip_cmd_coercion = '\x02';
      }
      (*p_Var5)(cmd_queue + wVar8);
    }
    if ((0 < cmd_queue[wVar8].nrepeats) &&
       (iVar9 = (cmd_tail + L'\x13') % 0x14, iVar3 == cmd_queue[iVar9].nrepeats)) {
      repeating = iVar3 + -1 != 0;
      cmd_queue[iVar9].nrepeats = iVar3 + -1;
      puVar2 = &player->upkeep->redraw;
      *puVar2 = *puVar2 | 0x8000;
    }
  }
LAB_0012fda7:
  return SUB41(wVar13,0);
}

Assistant:

bool cmdq_pop(cmd_context c)
{
	struct command *cmd;

	/* If we're repeating, just pull the last command again. */
	if (repeating) {
		cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];
	} else if (cmd_head != cmd_tail) {
		/* If we have a command ready, set it. */
		cmd = &cmd_queue[cmd_tail++];
		if (cmd_tail == CMD_QUEUE_SIZE)
			cmd_tail = 0;
	} else {
		/* Failure to get a command. */
		return false;
	}

	/* Now process it */
	if (!cmd->background_command) {
		last_command_idx = prev_cmd_idx(cmd_tail);
	}
	process_command(c, cmd);
	return true;
}